

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptional.cxx
# Opt level: O1

bool operator<=(EventLogger *lhs,EventLogger *rhs)

{
  Event local_30;
  
  local_30.Type = COMPARE_EE_LE;
  local_30.Value = lhs->Value;
  if (events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    local_30.Logger1 = lhs;
    local_30.Logger2 = rhs;
    std::vector<Event,_std::allocator<Event>_>::_M_realloc_insert<Event>
              (&events,(iterator)
                       events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_30);
  }
  else {
    (events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
    _M_finish)->Logger2 = rhs;
    *(ulong *)&(events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
                super__Vector_impl_data._M_finish)->Value = CONCAT44(local_30._28_4_,local_30.Value)
    ;
    *(ulong *)events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
              super__Vector_impl_data._M_finish = CONCAT44(local_30._4_4_,0x10);
    (events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
    _M_finish)->Logger1 = lhs;
    events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.super__Vector_impl_data.
    _M_finish = events.super__Vector_base<Event,_std::allocator<Event>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  return lhs->Value <= rhs->Value;
}

Assistant:

static bool operator<=(const EventLogger& lhs, const EventLogger& rhs)
{
  events.push_back({ Event::COMPARE_EE_LE, &lhs, &rhs, lhs.Value });
  return lhs.Value <= rhs.Value;
}